

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::impl::surplus_send_pairing
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *surpluses,int p,int rank,bool send_deficit)

{
  pointer puVar1;
  uint uVar2;
  pointer plVar3;
  _Elt_pointer ppVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  undefined7 in_register_00000081;
  byte bVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int rank_1;
  queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
  fifo;
  pair<int,_long> local_b0;
  uint local_a0;
  undefined4 local_9c;
  _Deque_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> local_98;
  ulong local_40;
  ulong local_38;
  
  local_9c = (undefined4)CONCAT71(in_register_00000081,send_deficit);
  local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a0 = rank;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,(long)p,(value_type_conflict2 *)&local_98,
             (allocator_type *)&local_b0);
  local_98._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::_M_initialize_map
            (&local_98,0);
  if (0 < p) {
    local_40 = (ulong)local_a0;
    uVar11 = 0;
    local_38 = (ulong)(uint)p;
    do {
      plVar3 = (surpluses->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = plVar3[uVar11];
      if (lVar5 != 0) {
        uVar10 = (uint)uVar11;
        if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_98._M_impl.super__Deque_impl_data._M_start._M_cur) {
          local_b0.second = lVar5;
          if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            local_b0.first = uVar10;
            std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
            _M_push_back_aux<std::pair<int,long>>
                      ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)&local_98,
                       &local_b0);
          }
          else {
LAB_001261a6:
            *(ulong *)local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 CONCAT44(local_b0._4_4_,uVar10);
            (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = local_b0.second;
            local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            local_b0.first = uVar10;
          }
        }
        else {
          plVar6 = plVar3 + uVar11;
          if (lVar5 < 1) {
            if ((local_98._M_impl.super__Deque_impl_data._M_start._M_cur)->second < 0) {
              local_b0.second = lVar5;
              if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                  local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) goto LAB_001261a6;
              local_b0.first = uVar10;
              std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
              _M_push_back_aux<std::pair<int,long>>
                        ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)&local_98
                         ,&local_b0);
            }
            else {
              bVar8 = uVar11 == local_40 & (byte)local_9c;
              ppVar4 = local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
              do {
                if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar4) {
                  local_b0.second = lVar5;
                  if (ppVar4 != local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1)
                  goto LAB_001261a6;
                  local_b0.first = uVar10;
                  std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
                  _M_push_back_aux<std::pair<int,long>>
                            ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)
                             &local_98,&local_b0);
                  break;
                }
                lVar9 = ppVar4->second;
                lVar12 = -lVar5;
                if (SBORROW8(lVar9,-lVar5) != lVar9 + lVar5 < 0) {
                  lVar12 = lVar9;
                }
                uVar2 = ppVar4->first;
                *plVar6 = lVar5 + lVar12;
                plVar6 = &ppVar4->second;
                *plVar6 = *plVar6 - lVar12;
                if (*plVar6 == 0) {
                  if (ppVar4 == local_98._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
                    operator_delete(local_98._M_impl.super__Deque_impl_data._M_start._M_first);
                    ppVar4 = local_98._M_impl.super__Deque_impl_data._M_start._M_node[1];
                    local_98._M_impl.super__Deque_impl_data._M_start._M_last = ppVar4 + 0x20;
                    local_98._M_impl.super__Deque_impl_data._M_start._M_cur = ppVar4;
                    local_98._M_impl.super__Deque_impl_data._M_start._M_first = ppVar4;
                    local_98._M_impl.super__Deque_impl_data._M_start._M_node =
                         local_98._M_impl.super__Deque_impl_data._M_start._M_node + 1;
                  }
                  else {
                    ppVar4 = ppVar4 + 1;
                    local_98._M_impl.super__Deque_impl_data._M_start._M_cur = ppVar4;
                  }
                }
                uVar7 = (long)(int)uVar2;
                if ((bVar8 != 0) || (uVar7 = uVar11, uVar2 == local_a0)) {
                  puVar1 = (__return_storage_ptr__->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + uVar7;
                  *puVar1 = *puVar1 + lVar12;
                }
                plVar6 = (surpluses->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_start + uVar11;
                lVar5 = *plVar6;
              } while (lVar5 < 0);
            }
          }
          else {
            ppVar4 = local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
            if ((local_98._M_impl.super__Deque_impl_data._M_start._M_cur)->second < 1) {
              do {
                if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar4) {
                  local_b0.second = lVar5;
                  if (ppVar4 != local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1)
                  goto LAB_001261a6;
                  local_b0.first = uVar10;
                  std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
                  _M_push_back_aux<std::pair<int,long>>
                            ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)
                             &local_98,&local_b0);
                  break;
                }
                lVar9 = -ppVar4->second;
                if (lVar5 < -ppVar4->second) {
                  lVar9 = lVar5;
                }
                uVar2 = ppVar4->first;
                *plVar6 = lVar5 - lVar9;
                plVar6 = &ppVar4->second;
                *plVar6 = *plVar6 + lVar9;
                if (*plVar6 == 0) {
                  if (ppVar4 == local_98._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
                    operator_delete(local_98._M_impl.super__Deque_impl_data._M_start._M_first);
                    ppVar4 = local_98._M_impl.super__Deque_impl_data._M_start._M_node[1];
                    local_98._M_impl.super__Deque_impl_data._M_start._M_last = ppVar4 + 0x20;
                    local_98._M_impl.super__Deque_impl_data._M_start._M_cur = ppVar4;
                    local_98._M_impl.super__Deque_impl_data._M_start._M_first = ppVar4;
                    local_98._M_impl.super__Deque_impl_data._M_start._M_node =
                         local_98._M_impl.super__Deque_impl_data._M_start._M_node + 1;
                  }
                  else {
                    ppVar4 = ppVar4 + 1;
                    local_98._M_impl.super__Deque_impl_data._M_start._M_cur = ppVar4;
                  }
                }
                uVar7 = (long)(int)uVar2;
                if ((uVar11 == local_40) ||
                   (uVar7 = uVar11, (char)local_9c == '\x01' && uVar2 == local_a0)) {
                  puVar1 = (__return_storage_ptr__->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + uVar7;
                  *puVar1 = *puVar1 + lVar9;
                }
                plVar6 = (surpluses->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_start + uVar11;
                lVar5 = *plVar6;
              } while (0 < lVar5);
            }
            else {
              local_b0.second = lVar5;
              if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                  local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) goto LAB_001261a6;
              local_b0.first = uVar10;
              std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
              _M_push_back_aux<std::pair<int,long>>
                        ((deque<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)&local_98
                         ,&local_b0);
            }
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_38);
  }
  if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_98._M_impl.super__Deque_impl_data._M_start._M_cur) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_b0);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)(uint)local_b0.first,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
           ,0xbd,"surplus_send_pairing","fifo.empty()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  std::_Deque_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::~_Deque_base
            (&local_98);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<size_t> surplus_send_pairing(std::vector<signed_size_t>& surpluses, int p, int rank, bool send_deficit = true) {
    // calculate the send and receive counts by a linear scan over
    // the surpluses, using a queue to keep track of all surpluses
    std::vector<size_t> send_counts(p, 0);
    std::queue<std::pair<int, signed_size_t> > fifo;
    for (int i = 0; i < p; ++i) {
        if (surpluses[i] == 0)
            continue;
        if (fifo.empty()) {
            fifo.push(std::make_pair(i, surpluses[i]));
        } else if (surpluses[i] > 0) {
            if (fifo.front().second > 0) {
                fifo.push(std::make_pair(i, surpluses[i]));
            } else {
                while (surpluses[i] > 0 && !fifo.empty())
                {
                    long long min = std::min(surpluses[i], -fifo.front().second);
                    int j = fifo.front().first;
                    surpluses[i] -= min;
                    fifo.front().second += min;
                    if (fifo.front().second == 0)
                        fifo.pop();
                    // these processors communicate!
                    if (rank == i)
                        send_counts[j] += min;
                    else if (rank == j && send_deficit)
                        send_counts[i] += min;
                }
                if (surpluses[i] > 0)
                    fifo.push(std::make_pair(i, surpluses[i]));
            }
        } else if (surpluses[i] < 0) {
            if (fifo.front().second < 0) {
                fifo.push(std::make_pair(i, surpluses[i]));
            } else {
                while (surpluses[i] < 0 && !fifo.empty())
                {
                    long long min = std::min(-surpluses[i], fifo.front().second);
                    int j = fifo.front().first;
                    surpluses[i] += min;
                    fifo.front().second -= min;
                    if (fifo.front().second == 0)
                        fifo.pop();
                    // these processors communicate!
                    if (rank == i && send_deficit)
                        send_counts[j] += min;
                    else if (rank == j)
                        send_counts[i] += min;
                }
                if (surpluses[i] < 0)
                    fifo.push(std::make_pair(i, surpluses[i]));
            }
        }
    }
    MXX_ASSERT(fifo.empty());

    return send_counts;
}